

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureTransform.h
# Opt level: O0

bool __thiscall Assimp::STransformVecInfo::IsUntransformed(STransformVecInfo *this)

{
  aiVector2D *paVar1;
  float *pfVar2;
  ai_real *paVar3;
  float fVar4;
  bool local_11;
  STransformVecInfo *this_local;
  
  paVar1 = &(this->super_aiUVTransform).mScaling;
  local_11 = false;
  if ((paVar1->x == 1.0) && (!NAN(paVar1->x))) {
    pfVar2 = &(this->super_aiUVTransform).mScaling.y;
    local_11 = false;
    if ((*pfVar2 == 1.0) && (!NAN(*pfVar2))) {
      fVar4 = (this->super_aiUVTransform).mTranslation.x;
      local_11 = false;
      if ((fVar4 == 0.0) && (!NAN(fVar4))) {
        fVar4 = (this->super_aiUVTransform).mTranslation.y;
        local_11 = false;
        if ((fVar4 == 0.0) && (!NAN(fVar4))) {
          paVar3 = &(this->super_aiUVTransform).mRotation;
          local_11 = *paVar3 <= 0.008726646 && *paVar3 != 0.008726646;
        }
      }
    }
  }
  return local_11;
}

Assistant:

inline bool IsUntransformed() const
    {
        return (1.0f == mScaling.x && 1.f == mScaling.y &&
            !mTranslation.x && !mTranslation.y &&
            mRotation < AI_TT_ROTATION_EPSILON);
    }